

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O3

Matrix * __thiscall LUPMatrix::GetMatrix(Matrix *__return_storage_ptr__,LUPMatrix *this)

{
  Permutation local_70;
  Matrix local_58;
  Matrix local_38;
  
  Permutation::GetInverse(&local_70,&this->row_permutation_);
  operator*(&local_58,&local_70,&this->l_);
  operator*(&local_38,&local_58,&this->u_);
  operator*(__return_storage_ptr__,&local_38,&this->column_permutation_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_38.elements_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_58.elements_);
  if (local_70.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix LUPMatrix::GetMatrix() const {
  return row_permutation_.GetInverse() * l_ * u_ * column_permutation_;
}